

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

float * stbi_loadf_from_callbacks
                  (stbi_io_callbacks *clbk,void *user,int *x,int *y,int *comp,int req_comp)

{
  float *pfVar1;
  stbi__context s;
  stbi__context sStack_108;
  
  stbi__start_callbacks(&sStack_108,clbk,user);
  pfVar1 = stbi__loadf_main(&sStack_108,x,y,comp,req_comp);
  return pfVar1;
}

Assistant:

STBIDEF float *stbi_loadf_from_callbacks(stbi_io_callbacks const *clbk, void *user, int *x, int *y, int *comp, int req_comp)
{
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) clbk, user);
   return stbi__loadf_main(&s,x,y,comp,req_comp);
}